

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_quadratic_model.hpp
# Opt level: O2

void __thiscall
cimod::BinaryQuadraticModel<unsigned_long,_double,_cimod::Sparse>::_initialize_quadmat
          (BinaryQuadraticModel<unsigned_long,_double,_cimod::Sparse> *this,SparseMatrix *mat,
          vector<unsigned_long,_std::allocator<unsigned_long>_> *labels_vec)

{
  unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
  labels;
  allocator_type local_62;
  undefined1 local_61;
  _Vector_base<unsigned_long,_std::allocator<unsigned_long>_> local_60;
  _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  local_48;
  
  Eigen::SparseMatrix<double,_1,_int>::operator=(&this->_quadmat,mat);
  std::
  _Hashtable<unsigned_long,unsigned_long,std::allocator<unsigned_long>,std::__detail::_Identity,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
  ::
  _Hashtable<__gnu_cxx::__normal_iterator<unsigned_long_const*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((_Hashtable<unsigned_long,unsigned_long,std::allocator<unsigned_long>,std::__detail::_Identity,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
              *)&local_48,
             (labels_vec->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl
             .super__Vector_impl_data._M_start,
             (labels_vec->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl
             .super__Vector_impl_data._M_finish,0,&local_60,&local_62,&local_61);
  std::vector<unsigned_long,std::allocator<unsigned_long>>::
  vector<std::__detail::_Node_iterator<unsigned_long,true,false>,void>
            ((vector<unsigned_long,std::allocator<unsigned_long>> *)&local_60,
             (_Node_iterator<unsigned_long,_true,_false>)local_48._M_before_begin._M_nxt,
             (_Node_iterator<unsigned_long,_true,_false>)0x0,&local_62);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::_M_move_assign
            (&this->_idx_to_label,&local_60);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base(&local_60);
  std::
  __sort<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,__gnu_cxx::__ops::_Iter_less_iter>
            ((this->_idx_to_label).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
             ._M_impl.super__Vector_impl_data._M_start,
             (this->_idx_to_label).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  _set_label_to_idx(this);
  std::
  _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable(&local_48);
  return;
}

Assistant:

inline void _initialize_quadmat( const SparseMatrix &mat, const std::vector<IndexType> &labels_vec ) {
      this->_quadmat = mat;
      std::unordered_set<IndexType> labels( labels_vec.begin(), labels_vec.end() );
      _idx_to_label = std::vector<IndexType>( labels.begin(), labels.end() );
      std::sort( _idx_to_label.begin(), _idx_to_label.end() );
      _set_label_to_idx();
    }